

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

int subprocess::util::read_atmost_n(FILE *fp,char *buf,size_t read_upto)

{
  long lVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long in_RDX;
  long in_RSI;
  FILE *in_RDI;
  long in_FS_OFFSET;
  int read_bytes;
  int eintr_cnter;
  int rbytes;
  int fd;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = fileno(in_RDI);
  local_30 = 0;
  local_34 = 0;
  do {
    while( true ) {
      sVar3 = read(__fd,(void *)(in_RSI + local_30),in_RDX - local_30);
      iVar2 = (int)sVar3;
      if (iVar2 == -1) break;
      if (iVar2 == 0) {
        local_c = local_30;
LAB_00817cfe:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return local_c;
        }
        __stack_chk_fail();
      }
      local_30 = iVar2 + local_30;
    }
    piVar4 = __errno_location();
    if (*piVar4 != 4) {
      local_c = -1;
      goto LAB_00817cfe;
    }
    if (0x31 < local_34) {
      local_c = -1;
      goto LAB_00817cfe;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static inline
  int read_atmost_n(FILE* fp, char* buf, size_t read_upto)
  {
#ifdef __USING_WINDOWS__
    return (int)fread(buf, 1, read_upto, fp);
#else
    int fd = fileno(fp);
    int rbytes = 0;
    int eintr_cnter = 0;

    while (1) {
      int read_bytes = read(fd, buf + rbytes, read_upto - rbytes);
      if (read_bytes == -1) {
        if (errno == EINTR) {
          if (eintr_cnter >= 50) return -1;
          eintr_cnter++;
          continue;
        }
        return -1;
      }
      if (read_bytes == 0) return rbytes;

      rbytes += read_bytes;
    }
    return rbytes;
#endif
  }